

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_strmode.c
# Opt level: O1

char * archive_entry_strmode(archive_entry_conflict *entry)

{
  uint uVar1;
  mode_t mVar2;
  mode_t mVar3;
  uint uVar4;
  wchar_t wVar5;
  char *pcVar6;
  char cVar7;
  long lVar8;
  
  builtin_strncpy(entry->strmode,"?rwxrwxrwx ",0xc);
  mVar2 = archive_entry_mode((archive_entry *)entry);
  mVar3 = archive_entry_filetype((archive_entry *)entry);
  uVar1 = mVar3 - 0x1000 >> 0xc;
  uVar4 = mVar3 << 0x14 | uVar1;
  if ((uVar4 < 0xc) && ((0xaabU >> (uVar1 & 0x1f) & 1) != 0)) {
    cVar7 = (&DAT_0082ef24)[uVar4];
  }
  else {
    pcVar6 = archive_entry_hardlink((archive_entry *)entry);
    cVar7 = 'h';
    if (pcVar6 == (char *)0x0) goto LAB_00616aaa;
  }
  entry->strmode[0] = cVar7;
LAB_00616aaa:
  pcVar6 = entry->strmode;
  lVar8 = 0;
  do {
    pcVar6 = pcVar6 + 1;
    if ((*(uint *)((long)archive_entry_strmode::permbits + lVar8) & mVar2) == 0) {
      *pcVar6 = '-';
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x24);
  if ((mVar2 >> 0xb & 1) != 0) {
    entry->strmode[3] = (char)((mVar2 & 0xff) >> 6) << 5 | 0x53;
  }
  if ((mVar2 >> 10 & 1) != 0) {
    entry->strmode[6] = ((byte)mVar2 & 8) << 2 | 0x53;
  }
  if ((mVar2 >> 9 & 1) != 0) {
    entry->strmode[9] = ((byte)mVar2 & 1) << 5 | 0x54;
  }
  wVar5 = archive_entry_acl_types((archive_entry *)entry);
  if (wVar5 != L'\0') {
    entry->strmode[10] = '+';
  }
  return entry->strmode;
}

Assistant:

const char *
archive_entry_strmode(struct archive_entry *entry)
{
	static const mode_t permbits[] =
	    { 0400, 0200, 0100, 0040, 0020, 0010, 0004, 0002, 0001 };
	char *bp = entry->strmode;
	mode_t mode;
	int i;

	/* Fill in a default string, then selectively override. */
	strcpy(bp, "?rwxrwxrwx ");

	mode = archive_entry_mode(entry);
	switch (archive_entry_filetype(entry)) {
	case AE_IFREG:  bp[0] = '-'; break;
	case AE_IFBLK:  bp[0] = 'b'; break;
	case AE_IFCHR:  bp[0] = 'c'; break;
	case AE_IFDIR:  bp[0] = 'd'; break;
	case AE_IFLNK:  bp[0] = 'l'; break;
	case AE_IFSOCK: bp[0] = 's'; break;
	case AE_IFIFO:  bp[0] = 'p'; break;
	default:
		if (archive_entry_hardlink(entry) != NULL) {
			bp[0] = 'h';
			break;
		}
	}

	for (i = 0; i < 9; i++)
		if (!(mode & permbits[i]))
			bp[i+1] = '-';

	if (mode & S_ISUID) {
		if (mode & 0100) bp[3] = 's';
		else bp[3] = 'S';
	}
	if (mode & S_ISGID) {
		if (mode & 0010) bp[6] = 's';
		else bp[6] = 'S';
	}
	if (mode & S_ISVTX) {
		if (mode & 0001) bp[9] = 't';
		else bp[9] = 'T';
	}
	if (archive_entry_acl_types(entry) != 0)
		bp[10] = '+';

	return (bp);
}